

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxArray * __thiscall amrex::BoxArray::convert(BoxArray *this,_func_Box_Box_ptr *fp)

{
  Long LVar1;
  code *in_RSI;
  BoxArray *in_RDI;
  int i;
  int N;
  BoxArray *in_stack_000000f8;
  BoxArray *in_stack_ffffffffffffffb0;
  Box *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  BoxArray *in_stack_ffffffffffffffd8;
  int local_18;
  
  LVar1 = size((BoxArray *)0xfbd8ad);
  if (0 < (int)LVar1) {
    uniqify(in_stack_000000f8);
    for (local_18 = 0; local_18 < (int)LVar1; local_18 = local_18 + 1) {
      operator[](in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
      (*in_RSI)(&stack0xffffffffffffffcc,&stack0xffffffffffffffb0);
      set(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
    }
  }
  return in_RDI;
}

Assistant:

BoxArray&
BoxArray::convert (Box (*fp)(const Box&))
{
    BL_ASSERT(!(fp == 0));

    const int N = size();
    if (N > 0) {
        uniqify();

#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N; ++i) {
            set(i,fp((*this)[i]));
        }
    }
    return *this;
}